

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilder::AddElement<long>
          (FlatBufferBuilder *this,voffset_t field,long e,long def)

{
  long *plVar1;
  long litle_endian_element;
  
  if ((e == def) && (this->force_defaults_ != true)) {
    return;
  }
  Align(this,8);
  plVar1 = (long *)vector_downward::make_space(&this->buf_,8);
  *plVar1 = e;
  TrackField(this,field,
             ((int)(this->buf_).reserved_ - *(int *)&(this->buf_).cur_) + *(int *)&(this->buf_).buf_
            );
  return;
}

Assistant:

void AddElement(voffset_t field, T e, T def) {
    // We don't serialize values equal to the default.
    if (e == def && !force_defaults_) return;
    auto off = PushElement(e);
    TrackField(field, off);
  }